

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

bool __thiscall
Clasp::SatPreprocessor::preprocess(SatPreprocessor *this,SharedContext *ctx,Options *opts)

{
  size_type sVar1;
  Clause *pCVar2;
  SatPreParams *this_00;
  bool bVar3;
  byte bVar4;
  ValueRep VVar5;
  uint32 uVar6;
  size_type sVar7;
  StatsCRef pPVar8;
  LitVec *pLVar9;
  ulong uVar10;
  Literal *pLVar11;
  reference ppCVar12;
  Solver *s_00;
  SatPreParams *in_RDX;
  SharedContext *in_RSI;
  long *in_RDI;
  ClauseRep CVar13;
  Result RVar14;
  Clause *c_1;
  size_type i_1;
  Literal x;
  Clause *c;
  size_type i;
  size_type j;
  const_iterator end_4;
  const_iterator it_4;
  uint32 varFrozen;
  bool limFrozen;
  Freeze act;
  iterator end_3;
  iterator it_3;
  range_iterator end_2;
  range_iterator it_2;
  pred_iterator end_1;
  pred_iterator it_1;
  const_iterator end;
  const_iterator it;
  OnExit onExit;
  Solver *s;
  Solver *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  Status in_stack_fffffffffffffd04;
  Solver *in_stack_fffffffffffffd08;
  SharedContext *in_stack_fffffffffffffd10;
  iterator in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  uint32 in_stack_fffffffffffffd24;
  Solver *in_stack_fffffffffffffd28;
  Solver *rep;
  Clause *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd60;
  DefaultAction *in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  ConstraintInfo local_114;
  ClauseRep local_110;
  ClauseHead *local_100;
  Status local_f8;
  Clause *local_f0;
  size_type local_e4;
  uint32 local_e0;
  Literal local_dc;
  Clause *local_d8;
  size_type local_cc;
  size_type local_c8;
  uint8 local_c1;
  const_iterator local_c0;
  const_iterator local_b8;
  uint32 local_b0;
  byte local_a9;
  uint32 local_94;
  iterator local_90;
  iterator local_88;
  num_iterator<unsigned_int> local_80;
  num_iterator<unsigned_int> local_7c;
  pred_iterator local_78;
  pred_iterator local_70;
  undefined4 local_68;
  uint32 local_64;
  iterator local_60;
  iterator local_48;
  Solver *local_28;
  SatPreParams *local_20;
  SharedContext *local_18;
  byte local_1;
  
  in_RDI[3] = (long)in_RSI;
  in_RDI[4] = (long)in_RDX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = SharedContext::master((SharedContext *)0x1d15c0);
  preprocess(Clasp::SharedContext&,Clasp::SatPreParams&)::OnExit::OnExit(Clasp::
  SatPreprocessor*,Clasp::SharedContext__
            ((OnExit *)in_stack_fffffffffffffd10,(SatPreprocessor *)in_stack_fffffffffffffd08,
             (SharedContext *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  local_48 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 8))
  ;
  local_60 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 8))
  ;
  for (; local_48 != local_60; local_48 = local_48 + 1) {
    local_64 = local_48->rep_;
    bVar3 = SharedContext::addUnary
                      ((SharedContext *)in_stack_fffffffffffffd08,
                       (Literal)(uint32)((ulong)in_stack_fffffffffffffd10 >> 0x20));
    CVar13.lits = local_110.lits;
    CVar13.info.super_ConstraintScore.rep = local_110.info.super_ConstraintScore.rep;
    CVar13._4_4_ = local_110._4_4_;
    if (!bVar3) {
      local_1 = 0;
      goto LAB_001d231d;
    }
  }
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 8));
  bVar3 = Solver::propagate(in_stack_fffffffffffffcf8);
  CVar13.lits = local_110.lits;
  CVar13.info.super_ConstraintScore.rep = local_110.info.super_ConstraintScore.rep;
  CVar13._4_4_ = local_110._4_4_;
  if (bVar3) {
    bVar3 = SharedContext::preserveModels(local_18);
    if (bVar3) {
      SatPreParams::disableBce
                ((SatPreParams *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    }
    bVar3 = SharedContext::preserveShown(local_18);
    if (bVar3) {
      local_70 = OutputTable::pred_begin((OutputTable *)0x1d1791);
      local_78 = OutputTable::pred_end((OutputTable *)0x1d17bc);
      for (; local_70 != local_78; local_70 = local_70 + 1) {
        Literal::var(&local_70->cond);
        SharedContext::setFrozen
                  (in_stack_fffffffffffffd10,(Var)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffd08 >> 0x18,0));
      }
      local_7c.val_ = (uint)OutputTable::vars_begin((OutputTable *)in_stack_fffffffffffffcf8);
      local_80.val_ = (uint)OutputTable::vars_end((OutputTable *)in_stack_fffffffffffffcf8);
      while (bVar3 = num_iterator<unsigned_int>::operator!=(&local_7c,&local_80), bVar3) {
        num_iterator<unsigned_int>::operator*(&local_7c);
        SharedContext::setFrozen
                  (in_stack_fffffffffffffd10,(Var)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffd08 >> 0x18,0));
        num_iterator<unsigned_int>::operator++(&local_7c);
      }
    }
    bVar3 = SharedContext::preserveHeuristic(local_18);
    if (bVar3) {
      local_88 = DomainTable::begin((DomainTable *)0x1d194d);
      local_90 = DomainTable::end((DomainTable *)0x1d1978);
      for (; uVar6 = (uint32)((ulong)in_stack_fffffffffffffd60 >> 0x20), local_88 != local_90;
          local_88 = local_88 + 1) {
        SharedContext::master((SharedContext *)0x1d19b5);
        local_94 = (uint32)DomainTable::ValueType::cond((ValueType *)in_stack_fffffffffffffcf8);
        bVar3 = Solver::isFalse(in_stack_fffffffffffffd08,
                                (Literal)(uint32)((ulong)in_stack_fffffffffffffd10 >> 0x20));
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          DomainTable::ValueType::var(local_88);
          SharedContext::setFrozen
                    (in_stack_fffffffffffffd10,(Var)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffd08 >> 0x18,0));
        }
      }
      preprocess(Clasp::SharedContext&,Clasp::SatPreParams&)::Freeze::Freeze(Clasp::SharedContext__
                ((Freeze *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (SharedContext *)in_stack_fffffffffffffcf8);
      SharedContext::defaultDomPref
                ((SharedContext *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      DomainTable::applyDefault
                ((SharedContext *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                 in_stack_fffffffffffffd68,uVar6);
      preprocess::Freeze::~Freeze((Freeze *)0x1d1acd);
    }
    local_a9 = 0;
    if ((((ulong)*local_20 >> 0x19 & 0x7f) != 0) &&
       (pPVar8 = SharedContext::stats((SharedContext *)in_RDI[3]), (pPVar8->vars).frozen != 0)) {
      pPVar8 = SharedContext::stats((SharedContext *)in_RDI[3]);
      local_b0 = (pPVar8->vars).frozen;
      pLVar9 = Solver::trail(local_28);
      local_b8 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin(pLVar9);
      pLVar9 = Solver::trail(local_28);
      local_c0 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(pLVar9);
      for (; local_b8 != local_c0; local_b8 = local_b8 + 1) {
        Literal::var(local_b8);
        local_c1 = (uint8)SharedContext::varInfo((SharedContext *)in_stack_fffffffffffffcf8,0);
        bVar3 = VarInfo::frozen((VarInfo *)0x1d1c67);
        local_b0 = local_b0 - bVar3;
      }
      uVar10 = (ulong)local_b0;
      uVar6 = Solver::numFreeVars((Solver *)0x1d1cc7);
      local_a9 = (double)(*(uint *)local_20 >> 0x19) < ((double)uVar10 / (double)uVar6) * 100.0;
    }
    this_00 = local_20;
    if (((ulong)*local_20 & 3) != 0) {
      uVar6 = numClauses((SatPreprocessor *)0x1d1d4d);
      bVar3 = SatPreParams::clauseLimit(this_00,uVar6);
      if (((!bVar3) && ((local_a9 & 1) == 0)) &&
         (bVar4 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_20), (bVar4 & 1) != 0)) {
        local_c8 = 0;
        for (local_cc = 0; sVar1 = local_cc,
            sVar7 = bk_lib::
                    pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                    ::size((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                            *)(in_RDI + 6)), sVar1 != sVar7; local_cc = local_cc + 1) {
          ppCVar12 = bk_lib::
                     pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                     ::operator[]((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                                   *)(in_RDI + 6),local_cc);
          local_d8 = *ppCVar12;
          ppCVar12 = bk_lib::
                     pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                     ::operator[]((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                                   *)(in_RDI + 6),local_cc);
          *ppCVar12 = (Clause *)0x0;
          Clause::simplify(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
          pLVar11 = Clause::operator[](local_d8,0);
          local_dc.rep_ = pLVar11->rep_;
          Literal::var(&local_dc);
          VVar5 = Solver::value((Solver *)
                                CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                (Var)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
          sVar1 = local_c8;
          pCVar2 = local_d8;
          if (VVar5 == '\0') {
            local_c8 = local_c8 + 1;
            ppCVar12 = bk_lib::
                       pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                       ::operator[]((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                                     *)(in_RDI + 6),sVar1);
            *ppCVar12 = pCVar2;
          }
          else {
            Clause::destroy((Clause *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00))
            ;
            local_e0 = local_dc.rep_;
            bVar3 = SharedContext::addUnary
                              ((SharedContext *)in_stack_fffffffffffffd08,
                               (Literal)(uint32)((ulong)in_stack_fffffffffffffd10 >> 0x20));
            CVar13.lits = local_110.lits;
            CVar13.info.super_ConstraintScore.rep = local_110.info.super_ConstraintScore.rep;
            CVar13._4_4_ = local_110._4_4_;
            if (!bVar3) {
              local_1 = 0;
              goto LAB_001d231d;
            }
          }
        }
        bk_lib::
        pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
        ::begin((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                 *)(in_RDI + 6));
        bk_lib::
        pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
        ::end((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
               *)(in_RDI + 6));
        bk_lib::
        pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
        ::erase((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                 *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                in_stack_fffffffffffffd18,(iterator)in_stack_fffffffffffffd10);
        freezeSeen((SatPreprocessor *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00))
        ;
        bVar3 = Solver::propagate(in_stack_fffffffffffffcf8);
        if ((!bVar3) || (bVar4 = (**(code **)(*in_RDI + 0x20))(), (bVar4 & 1) == 0)) {
          CVar13.lits = local_110.lits;
          CVar13.info.super_ConstraintScore.rep = local_110.info.super_ConstraintScore.rep;
          CVar13._4_4_ = local_110._4_4_;
          local_1 = 0;
          goto LAB_001d231d;
        }
      }
    }
    bVar3 = Solver::simplify(in_stack_fffffffffffffd08);
    if (bVar3) {
      local_e4 = 0;
      while( true ) {
        sVar1 = local_e4;
        sVar7 = bk_lib::
                pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                ::size((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                        *)(in_RDI + 6));
        if (sVar1 == sVar7) break;
        ppCVar12 = bk_lib::
                   pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                   ::operator[]((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                                 *)(in_RDI + 6),local_e4);
        local_f0 = *ppCVar12;
        if (local_f0 != (Clause *)0x0) {
          rep = local_28;
          s_00 = (Solver *)Clause::operator[](local_f0,0);
          uVar6 = (uint32)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
          in_stack_fffffffffffffd24 = Clause::size(local_f0);
          ConstraintInfo::ConstraintInfo(&local_114,Static);
          CVar13 = ClauseRep::create((Literal *)
                                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                     uVar6,(Info *)0x1d21aa);
          local_110 = CVar13;
          RVar14 = ClauseCreator::create(s_00,(ClauseRep *)rep,in_stack_fffffffffffffd24);
          local_100 = RVar14.local;
          in_stack_fffffffffffffd04 = RVar14.status;
          local_f8 = in_stack_fffffffffffffd04;
          bVar3 = ClauseCreator::Result::operator_cast_to_bool((Result *)0x1d2232);
          in_stack_fffffffffffffd00 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd00);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            local_1 = 0;
            CVar13 = local_110;
            goto LAB_001d231d;
          }
          in_stack_fffffffffffffcf8 =
               (Solver *)
               bk_lib::
               pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
               ::operator[]((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                             *)(in_RDI + 6),local_e4);
          *(Clause **)in_stack_fffffffffffffcf8 = (Clause *)0x0;
          Clause::destroy((Clause *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        }
        local_e4 = local_e4 + 1;
      }
      bk_lib::
      pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
      ::pod_vector((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                    *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      bk_lib::
      pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
      ::swap((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
              *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
              *)in_stack_fffffffffffffcf8);
      bk_lib::
      pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
      ::~pod_vector((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                     *)0x1d22e5);
      local_1 = 1;
      CVar13 = local_110;
    }
    else {
      local_1 = 0;
      CVar13 = local_110;
    }
  }
  else {
    local_1 = 0;
  }
LAB_001d231d:
  local_68 = 1;
  local_110 = CVar13;
  preprocess::OnExit::~OnExit
            ((OnExit *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  return (bool)(local_1 & 1);
}

Assistant:

bool SatPreprocessor::preprocess(SharedContext& ctx, Options& opts) {
	ctx_  = &ctx;
	opts_ = &opts;
	Solver* s = ctx_->master();
	struct OnExit {
		SharedContext*   ctx;
		SatPreprocessor* self;
		SatPreprocessor* rest;
		OnExit(SatPreprocessor* s, SharedContext* c) : ctx(c), self(s), rest(0) {
			if (ctx && ctx->satPrepro.get() == s) { rest = ctx->satPrepro.release(); }
		}
		~OnExit() {
			if (self) self->cleanUp();
			if (rest) ctx->satPrepro.reset(rest);
		}
	} onExit(this, &ctx);
	for (LitVec::const_iterator it = units_.begin(), end = units_.end(); it != end; ++it) {
		if (!ctx.addUnary(*it)) return false;
	}
	units_.clear();
	// skip preprocessing if other constraints are UNSAT
	if (!s->propagate()) return false;
	if (ctx.preserveModels()) {
		opts.disableBce();
	}
	if (ctx.preserveShown()) {
		for (OutputTable::pred_iterator it = ctx.output.pred_begin(), end = ctx.output.pred_end(); it != end; ++it) {
			ctx.setFrozen(it->cond.var(), true);
		}
		for (OutputTable::range_iterator it = ctx.output.vars_begin(), end = ctx.output.vars_end(); it != end; ++it) {
			ctx.setFrozen(*it, true);
		}
	}
	if (ctx.preserveHeuristic()) {
		for (DomainTable::iterator it = ctx.heuristic.begin(), end = ctx.heuristic.end(); it != end; ++it) {
			if (!ctx.master()->isFalse(it->cond())) {
				ctx.setFrozen(it->var(), true);
			}
		}
		struct Freeze : DomainTable::DefaultAction {
			explicit Freeze(SharedContext& c) : ctx(&c) {}
			void atom(Literal p, HeuParams::DomPref, uint32) { ctx->setFrozen(p.var(), true); }
			SharedContext* ctx;
		} act(ctx);
		DomainTable::applyDefault(ctx, act, ctx.defaultDomPref());
	}

	// preprocess only if not too many vars are frozen or not too many clauses
	bool limFrozen = false;
	if (opts.limFrozen != 0 && ctx_->stats().vars.frozen) {
		uint32 varFrozen = ctx_->stats().vars.frozen;
		for (LitVec::const_iterator it = s->trail().begin(), end = s->trail().end(); it != end; ++it) {
 			varFrozen -= (ctx_->varInfo(it->var()).frozen());
 		}
		limFrozen = ((varFrozen / double(s->numFreeVars())) * 100.0) > double(opts.limFrozen);
	}
	// 1. remove SAT-clauses, strengthen clauses w.r.t false literals, attach
	if (opts.type != 0 && !opts.clauseLimit(numClauses()) && !limFrozen && initPreprocess(opts)) {
		ClauseList::size_type j = 0;
		for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
			Clause* c   = clauses_[i]; assert(c);
			clauses_[i] = 0;
			c->simplify(*s);
			Literal x   = (*c)[0];
			if (s->value(x.var()) == value_free) {
				clauses_[j++] = c;
			}
			else {
				c->destroy();
				if (!ctx.addUnary(x)) { return false; }
			}
		}
		clauses_.erase(clauses_.begin()+j, clauses_.end());
		// 2. run preprocessing
		freezeSeen();
		if (!s->propagate() || !doPreprocess()) {
			return false;
		}
	}
	// simplify other constraints w.r.t any newly derived top-level facts
	if (!s->simplify()) return false;
	// 3. move preprocessed clauses to ctx
	for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
		if (Clause* c = clauses_[i]) {
			if (!ClauseCreator::create(*s, ClauseRep::create(&(*c)[0], c->size()), 0)) {
				return false;
			}
			clauses_[i] = 0;
			c->destroy();
		}
	}
	ClauseList().swap(clauses_);
	return true;
}